

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spp.cpp
# Opt level: O3

void __thiscall
SPP::EarthRotationFix(SPP *this,double deltat,XYZ SatPosition,NavSys flag,XYZ *fixed)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  Vector3d result;
  double local_68;
  Matrix<double,_3,_3> local_58;
  Matrix<double,_3,_1> local_48;
  Matrix<double,_3,_1> local_38;
  
  local_48.rows = 3;
  local_48.cols = 1;
  local_48.data = (double *)operator_new__(0x18);
  local_58.rows = 3;
  local_58.cols = 3;
  local_58.data = (double *)operator_new__(0x48);
  pdVar3 = Matrix<double,_3,_1>::operator()(&local_48,0,0);
  *pdVar3 = SatPosition.X;
  pdVar3 = Matrix<double,_3,_1>::operator()(&local_48,1,0);
  *pdVar3 = SatPosition.Y;
  pdVar3 = Matrix<double,_3,_1>::operator()(&local_48,2,0);
  *pdVar3 = SatPosition.Z;
  dVar1 = deltat * *(double *)(&DAT_001115c0 + (ulong)(flag == BDS) * 8);
  dVar2 = cos(dVar1);
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_58,0,0);
  *pdVar3 = dVar2;
  dVar2 = sin(dVar1);
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_58,0,1);
  *pdVar3 = dVar2;
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_58,0,2);
  *pdVar3 = 0.0;
  local_68 = sin(dVar1);
  local_68 = -local_68;
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_58,1,0);
  *pdVar3 = local_68;
  dVar1 = cos(dVar1);
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_58,1,1);
  *pdVar3 = dVar1;
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_58,1,2);
  *pdVar3 = 0.0;
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_58,2,0);
  *pdVar3 = 0.0;
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_58,2,1);
  *pdVar3 = 0.0;
  pdVar3 = Matrix<double,_3,_3>::operator()(&local_58,2,2);
  *pdVar3 = 1.0;
  local_38 = Matrix<double,3,3>::operator*((Matrix<double,3,3> *)&local_58,&local_48);
  pdVar3 = Matrix<double,_3,_1>::operator()(&local_38,0,0);
  fixed->X = *pdVar3;
  pdVar3 = Matrix<double,_3,_1>::operator()(&local_38,1,0);
  fixed->Y = *pdVar3;
  pdVar3 = Matrix<double,_3,_1>::operator()(&local_38,2,0);
  fixed->Z = *pdVar3;
  if (local_38.data != (double *)0x0) {
    operator_delete__(local_38.data);
  }
  if (local_48.data != (double *)0x0) {
    operator_delete__(local_48.data);
  }
  if (local_58.data != (double *)0x0) {
    operator_delete__(local_58.data);
  }
  return;
}

Assistant:

void SPP::EarthRotationFix(double deltat, XYZ SatPosition, NavSys flag, XYZ &fixed)
{
    Vector3d pos;
    Matrix3d R;
    double rate;
    if(flag == GPS)
        rate = GPSROTATIONRATE;
    if(flag == BDS)
        rate = BDSROTATIONRATE;
    // GPS
    pos(0, 0) = SatPosition.X;
    pos(1, 0) = SatPosition.Y;
    pos(2, 0) = SatPosition.Z;

    R(0, 0) = cos(deltat * rate);
    R(0, 1) = sin(deltat * rate);
    R(0, 2) = 0;

    R(1, 0) = -sin(deltat * rate);
    R(1, 1) = cos(deltat * rate);
    R(1, 2) = 0;

    R(2, 0) = 0;
    R(2, 1) = 0;
    R(2, 2) = 1;

    Vector3d result = R * pos;
    fixed.X = result(0, 0);
    fixed.Y = result(1, 0);
    fixed.Z = result(2, 0);

    result.deleteMatrix();
    pos.deleteMatrix();
    R.deleteMatrix();
}